

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::TryAllocFreePages<false>
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  size_t *psVar1;
  RealCount *pRVar2;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_00;
  char *address;
  ulong uVar8;
  DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar9;
  Iterator local_40;
  
  uVar8 = (ulong)pageCount;
  iVar6 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar6 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x3e5,"(!HasMultiThreadAccess())","!HasMultiThreadAccess()");
    if (!bVar5) {
LAB_00704f5e:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  if (this->freePageCount < uVar8) {
LAB_00704e75:
    address = TryAllocFromZeroPages(this,pageCount,pageSegment);
  }
  else {
    pDVar9 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)&this->segments;
    local_40.list =
         (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)pDVar9;
    local_40.current = (NodeBase *)pDVar9;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (pDVar9 == (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_00704f5e;
        *puVar7 = 0;
        pDVar9 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
                 local_40.current;
      }
      if ((DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
          (pDVar9->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.
          base == (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)local_40.list)
      goto LAB_00704e75;
      local_40.current =
           (NodeBase *)
           (pDVar9->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next
           .base;
      this_00 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator
                ::Data(&local_40);
      address = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>(this_00,pageCount);
      pDVar9 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)local_40.current;
    } while (address == (char *)0x0);
    this->usedBytes = this->usedBytes + uVar8 * 0x1000;
    LOCK();
    totalUsedBytes = totalUsedBytes + uVar8 * 0x1000;
    UNLOCK();
    if (maxUsedBytes < totalUsedBytes) {
      maxUsedBytes = totalUsedBytes;
    }
    if (this->memoryData != (PageMemoryData *)0x0) {
      psVar1 = &this->memoryData->allocPageCount;
      *psVar1 = *psVar1 + uVar8;
    }
    if (this_00->freePageCount == 0) {
      pDVar3 = ((local_40.current)->next).base;
      pDVar9 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
               ((anon_union_8_3_7fb8a913_for_prev *)(&(local_40.current)->next + 1))->base;
      (pDVar9->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.base
           = pDVar3;
      pDVar3->prev = *(anon_union_8_3_7fb8a913_for_prev *)(&(local_40.current)->next + 1);
      pDVar3 = (this->fullSegments).
               super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>.next.base;
      *(anon_union_8_3_7fb8a913_for_prev *)(&(local_40.current)->next + 1) = pDVar3->prev;
      ((local_40.current)->next).base = pDVar3;
      *(NodeBase **)pDVar3->prev = local_40.current;
      (pDVar3->prev).node =
           (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)local_40.current;
      ((local_40.list)->super_RealCount).count = ((local_40.list)->super_RealCount).count - 1;
      pRVar2 = &(this->fullSegments).super_RealCount;
      pRVar2->count = pRVar2->count + 1;
      local_40.current = (NodeBase *)pDVar9;
    }
    uVar8 = this->freePageCount - uVar8;
    this->freePageCount = uVar8;
    *pageSegment = this_00;
    if (uVar8 < this->debugMinFreePageCount) {
      this->debugMinFreePageCount = uVar8;
    }
    FillAllocPages(this,address,pageCount);
  }
  return address;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocFreePages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!HasMultiThreadAccess());
    char* pages = nullptr;

    if (this->freePageCount >= pageCount)
    {
        FAULTINJECT_MEMORY_NOTHROW(this->debugName, pageCount*AutoSystemInfo::PageSize);
        typename DListBase<TPageSegment>::EditingIterator i(&this->segments);

        while (i.Next())
        {
            TPageSegment * freeSegment = &i.Data();

            pages = freeSegment->template AllocPages<notPageAligned>(pageCount);
            if (pages != nullptr)
            {
                LogAllocPages(pageCount);
                if (freeSegment->GetFreePageCount() == 0)
                {
                    i.MoveCurrentTo(&this->fullSegments);
                }

                this->freePageCount -= pageCount;
                *pageSegment = freeSegment;

#if DBG
                UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
                this->FillAllocPages(pages, pageCount);
                return pages;
            }
        }
    }

    pages = TryAllocFromZeroPages(pageCount, pageSegment);

    return pages;
}